

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O1

uint64_t lzma_mt_block_size(lzma_filter *filters)

{
  lzma_vli lVar1;
  uint64_t uVar2;
  long lVar3;
  ulong uVar4;
  lzma_filter_encoder *plVar5;
  long lVar6;
  ulong uVar7;
  bool bVar8;
  
  lVar1 = filters->id;
  if (lVar1 == 0xffffffffffffffff) {
LAB_001a1705:
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    lVar6 = 0;
    do {
      if (lVar1 == 0x4000000000000001) {
        lVar3 = 0;
      }
      else {
        plVar5 = encoders;
        lVar3 = 0;
        do {
          plVar5 = plVar5 + 1;
          lVar3 = lVar3 + 1;
        } while (plVar5->id != lVar1);
      }
      if (encoders[lVar3].block_size == (_func_uint64_t_void_ptr *)0x0) {
        bVar8 = true;
      }
      else {
        uVar2 = (*encoders[lVar3].block_size)(filters[lVar6].options);
        uVar4 = uVar7;
        if (uVar7 < uVar2) {
          uVar4 = uVar2;
        }
        bVar8 = uVar2 != 0;
        if (bVar8) {
          uVar7 = uVar4;
        }
      }
      if (!bVar8) goto LAB_001a1705;
      lVar6 = lVar6 + 1;
      lVar1 = filters[lVar6].id;
    } while (lVar1 != 0xffffffffffffffff);
  }
  return uVar7;
}

Assistant:

extern uint64_t
lzma_mt_block_size(const lzma_filter *filters)
{
	uint64_t max = 0;

	for (size_t i = 0; filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		const lzma_filter_encoder *const fe
				= encoder_find(filters[i].id);
		if (fe->block_size != NULL) {
			const uint64_t size
					= fe->block_size(filters[i].options);
			if (size == 0)
				return 0;

			if (size > max)
				max = size;
		}
	}

	return max;
}